

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_emit.cpp
# Opt level: O2

void __thiscall
ExportEmitString_EscapeQuotes_Test::~ExportEmitString_EscapeQuotes_Test
          (ExportEmitString_EscapeQuotes_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ExportEmitString, EscapeQuotes) {
    using namespace std::string_literals;

    pstore::exchange::export_ns::ostringstream os;
    auto const str = R"(a " b)"s;
    pstore::exchange::export_ns::emit_string (os, std::begin (str), std::end (str));
    constexpr auto * expected = R"("a \" b")";
    EXPECT_EQ (os.str (), expected);
}